

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MultiPortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MultiPortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::PortSymbol_const*,18446744073709551615ul>,slang::ast::ArgumentDirection&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,
          span<const_slang::ast::PortSymbol_*,_18446744073709551615UL> *args_2,
          ArgumentDirection *args_3)

{
  ArgumentDirection AVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  pointer ppPVar5;
  size_t sVar6;
  MultiPortSymbol *pMVar7;
  
  pMVar7 = (MultiPortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MultiPortSymbol *)this->endPtr < pMVar7 + 1) {
    pMVar7 = (MultiPortSymbol *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pMVar7 + 1);
  }
  sVar3 = args->_M_len;
  pcVar4 = args->_M_str;
  SVar2 = *args_1;
  ppPVar5 = args_2->_M_ptr;
  sVar6 = (args_2->_M_extent)._M_extent_value;
  AVar1 = *args_3;
  (pMVar7->super_Symbol).kind = MultiPort;
  (pMVar7->super_Symbol).name._M_len = sVar3;
  (pMVar7->super_Symbol).name._M_str = pcVar4;
  (pMVar7->super_Symbol).location = SVar2;
  (pMVar7->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pMVar7->super_Symbol).parentScope = (Scope *)0x0;
  (pMVar7->super_Symbol).nextInScope = (Symbol *)0x0;
  (pMVar7->super_Symbol).indexInScope = 0;
  (pMVar7->ports)._M_ptr = ppPVar5;
  (pMVar7->ports)._M_extent._M_extent_value = sVar6;
  pMVar7->direction = AVar1;
  pMVar7->isNullPort = false;
  pMVar7->type = (Type *)0x0;
  return pMVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }